

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void slang::ast::PrimitiveInstanceSymbol::fromSyntax
               (PrimitiveInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  Token *this;
  char_pointer puVar1;
  group_type_pointer pgVar2;
  SymbolKind *pSVar3;
  ResolvedConfig *pRVar4;
  size_t sVar5;
  long lVar6;
  size_t __n;
  void *__s1;
  size_t sVar7;
  ConfigRule *pCVar8;
  HierarchicalInstanceSyntax *this_00;
  ulong uVar9;
  uint uVar10;
  string_view sVar11;
  optional<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_> *poVar12;
  char *__s1_00;
  int iVar13;
  InstanceBodySymbol *pIVar14;
  PrimitiveSymbol *primitive;
  Scope *pSVar15;
  int *piVar16;
  uint64_t uVar17;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar18;
  char_pointer puVar19;
  uint uVar20;
  ulong uVar21;
  ConfigBlockSymbol *pCVar22;
  value_type_pointer ppVar23;
  table_element_pointer ppVar24;
  value_type_pointer ppVar25;
  ulong uVar26;
  value_type_pointer ppVar27;
  ulong uVar28;
  ulong uVar29;
  ConfigBlockSymbol *pCVar30;
  group_type_pointer pgVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  long lVar35;
  char_pointer puVar36;
  iterator __begin4;
  Symbol *defResult_00;
  Compilation *this_01;
  InstanceOverride *this_02;
  bool bVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 uVar43;
  uchar uVar44;
  byte bVar45;
  uchar uVar46;
  byte bVar47;
  uchar uVar48;
  byte bVar49;
  uchar uVar50;
  undefined1 uVar51;
  uchar uVar52;
  byte bVar53;
  uchar uVar54;
  byte bVar55;
  uchar uVar56;
  byte bVar57;
  uchar uVar58;
  undefined1 uVar59;
  uchar uVar60;
  byte bVar61;
  uchar uVar62;
  byte bVar63;
  uchar uVar64;
  byte bVar65;
  uchar uVar66;
  undefined1 uVar67;
  uchar uVar68;
  byte bVar69;
  uchar uVar70;
  byte bVar71;
  uchar uVar72;
  byte bVar73;
  uchar uVar74;
  string_view sVar75;
  iterator iVar76;
  Symbol *sym;
  anon_class_48_6_08dfe5ab createPrims;
  DefinitionLookupResult defResult_1;
  SmallVector<const_slang::ast::Symbol_*,_5UL> parentStack;
  DefinitionLookupResult defResult;
  string_view rootName;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  implicitNetNames;
  InstanceBodySymbol *local_2f8;
  ConfigBlockSymbol *local_2d8;
  ConfigRule *local_2c8;
  pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
  local_2b8;
  undefined8 local_298;
  uchar uStack_290;
  uchar uStack_28f;
  uchar uStack_28e;
  uchar uStack_28d;
  uchar uStack_28c;
  uchar uStack_28b;
  uchar uStack_28a;
  uchar uStack_289;
  ConfigBlockSymbol *local_288;
  string_view local_280;
  Compilation *local_270;
  undefined8 local_268;
  undefined1 uStack_260;
  byte bStack_25f;
  byte bStack_25e;
  byte bStack_25d;
  undefined1 uStack_25c;
  byte bStack_25b;
  byte bStack_25a;
  byte bStack_259;
  Compilation *local_258;
  string_view local_250;
  long local_240;
  ulong local_238;
  group_type_pointer local_230;
  ulong local_228;
  ulong local_220;
  SourceRange local_218;
  SourceRange local_208;
  SourceRange local_1f8;
  anon_class_48_6_08dfe5ab local_1e8;
  DefinitionLookupResult local_1b8;
  undefined1 *local_1a0;
  InstanceBodySymbol *local_198;
  undefined8 local_190;
  undefined1 local_188 [40];
  DefinitionLookupResult local_160;
  Symbol local_148;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  undefined1 local_f8 [144];
  undefined1 local_68 [32];
  undefined8 local_48;
  undefined8 local_40;
  
  local_68._0_8_ = 0x3f;
  local_68._8_8_ = 1;
  local_68._16_16_ = ZEXT816(0x516460);
  local_48 = 0;
  local_40 = 0;
  local_270 = ((context->scope).ptr)->compilation;
  this = &syntax->type;
  local_f8._128_8_ = (Storage *)local_f8;
  local_f8._136_8_ = (Storage *)local_f8;
  sVar75 = parsing::Token::valueText(this);
  this_01 = local_270;
  if (this->kind == Identifier) {
    local_1e8.comp = local_270;
    local_280 = sVar75;
    local_1e8.syntax = syntax;
    local_1e8.context = context;
    local_1e8.results = results;
    local_1e8.implicitNets = implicitNets;
    local_1e8.implicitNetNames =
         (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
          *)local_f8;
    pIVar14 = Scope::getContainingInstance((context->scope).ptr);
    sVar11._M_str = local_250._M_str;
    sVar11._M_len = local_250._M_len;
    sVar75._M_str = local_250._M_str;
    sVar75._M_len = local_250._M_len;
    if (((pIVar14 != (InstanceBodySymbol *)0x0) &&
        (local_250 = sVar75, pIVar14->parentInstance != (InstanceSymbol *)0x0)) &&
       (pRVar4 = pIVar14->parentInstance->resolvedConfig, local_250 = sVar11,
       pRVar4 != (ResolvedConfig *)0x0)) {
      local_160.definition = &local_148;
      local_160.configRoot = (ConfigBlockSymbol *)0x0;
      local_160.configRule = (ConfigRule *)0x2;
      pCVar30 = pRVar4->useConfig;
      if (pCVar30->resolved == false) {
        ConfigBlockSymbol::resolve(pCVar30);
      }
      if ((pCVar30->instanceOverrides).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
          .size_ctrl.size != 0) {
        pSVar15 = (context->scope).ptr;
        local_1a0 = local_188;
        local_198 = (InstanceBodySymbol *)0x0;
        local_190 = 5;
        local_298 = pCVar30;
        do {
          local_2b8.first.definition = pSVar15->thisSym;
          if ((((InstanceSymbolBase *)
               &((InstanceBodySymbol *)local_2b8.first.definition)->super_Symbol)->super_Symbol).
              kind == InstanceBody) {
            local_2b8.first.definition =
                 (Symbol *)((InstanceBodySymbol *)local_2b8.first.definition)->parentInstance;
          }
          SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                    ((SmallVectorBase<slang::ast::Symbol_const*> *)&local_1a0,(Symbol **)&local_2b8)
          ;
          pSVar15 = (((InstanceSymbolBase *)&(local_2b8.first.definition)->kind)->super_Symbol).
                    parentScope;
        } while ((pSVar15 != (Scope *)0x0) &&
                ((InstanceBodySymbol *)pRVar4->rootInstance !=
                 (InstanceBodySymbol *)local_2b8.first.definition));
        piVar16 = *(int **)(local_1a0 + (long)local_198 * 8 + -8);
        if (*piVar16 == 0x2f) {
          piVar16 = *(int **)(*(long *)(piVar16 + 0x14) + 0x90);
        }
        local_108._M_len = *(size_t *)(piVar16 + 2);
        local_108._M_str = *(char **)(piVar16 + 4);
        uVar17 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &pCVar30->instanceOverrides,&local_108);
        __s1_00 = local_108._M_str;
        sVar7 = local_108._M_len;
        uVar26 = uVar17 >> ((byte)(local_298->instanceOverrides).table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                  .arrays.groups_size_index & 0x3f);
        pgVar31 = (local_298->instanceOverrides).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                  .arrays.groups_;
        lVar35 = (uVar17 & 0xff) * 4;
        uVar44 = (&UNK_0051605c)[lVar35];
        uVar46 = (&UNK_0051605d)[lVar35];
        uVar48 = (&UNK_0051605e)[lVar35];
        uVar50 = (&UNK_0051605f)[lVar35];
        uVar21 = 0;
        do {
          pIVar14 = (InstanceBodySymbol *)(uVar26 * 0x10);
          pgVar2 = pgVar31 + uVar26;
          auVar39[0] = -(pgVar2->m[0].n == uVar44);
          auVar39[1] = -(pgVar2->m[1].n == uVar46);
          auVar39[2] = -(pgVar2->m[2].n == uVar48);
          auVar39[3] = -(pgVar2->m[3].n == uVar50);
          auVar39[4] = -(pgVar2->m[4].n == uVar44);
          auVar39[5] = -(pgVar2->m[5].n == uVar46);
          auVar39[6] = -(pgVar2->m[6].n == uVar48);
          auVar39[7] = -(pgVar2->m[7].n == uVar50);
          auVar39[8] = -(pgVar2->m[8].n == uVar44);
          auVar39[9] = -(pgVar2->m[9].n == uVar46);
          auVar39[10] = -(pgVar2->m[10].n == uVar48);
          auVar39[0xb] = -(pgVar2->m[0xb].n == uVar50);
          auVar39[0xc] = -(pgVar2->m[0xc].n == uVar44);
          auVar39[0xd] = -(pgVar2->m[0xd].n == uVar46);
          auVar39[0xe] = -(pgVar2->m[0xe].n == uVar48);
          auVar39[0xf] = -(pgVar2->m[0xf].n == uVar50);
          uVar20 = (uint)(ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe);
          if (uVar20 != 0) {
            ppVar27 = (local_298->instanceOverrides).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      .arrays.elements_ + uVar26 * 0xf;
            local_268 = ppVar27;
            do {
              uVar10 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                }
              }
              ppVar25 = ppVar27 + uVar10;
              sVar5 = (ppVar25->first)._M_len;
              bVar37 = sVar7 == sVar5;
              if ((sVar7 != 0) && (sVar7 == sVar5)) {
                iVar13 = bcmp(__s1_00,(ppVar25->first)._M_str,sVar7);
                bVar37 = iVar13 == 0;
                ppVar27 = local_268;
              }
              local_2f8 = pIVar14;
              if (bVar37) goto LAB_002c9804;
              uVar20 = uVar20 - 1 & uVar20;
            } while (uVar20 != 0);
          }
          if ((pgVar31->m
               [(long)((long)&(((InstanceSymbolBase *)&pIVar14->super_Symbol)->super_Symbol).name.
                              _M_len + 7)].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7]) == 0) break;
          uVar34 = (local_298->instanceOverrides).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                   .arrays.groups_size_mask;
          lVar35 = uVar26 + uVar21;
          uVar21 = uVar21 + 1;
          uVar26 = lVar35 + 1U & uVar34;
        } while (uVar21 <= uVar34);
        ppVar25 = (value_type_pointer)0x0;
LAB_002c9804:
        pIVar14 = local_198;
        if (ppVar25 != (value_type_pointer)0x0) {
          do {
            ppVar27 = ppVar25;
            this_02 = &ppVar27->second;
            pIVar14 = (InstanceBodySymbol *)
                      ((long)&pIVar14[-1].parameters._M_extent._M_extent_value + 7);
            if (pIVar14 == (InstanceBodySymbol *)0x0) break;
            lVar6 = *(long *)(local_1a0 + (long)pIVar14 * 8 + -8);
            uVar17 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )this_02,(basic_string_view<char,_std::char_traits<char>_> *)
                                         (lVar6 + 8));
            uVar21 = uVar17 >> ((byte)(this_02->childNodes).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                      .arrays.groups_size_index & 0x3f);
            pCVar30 = (ConfigBlockSymbol *)
                      (ppVar27->second).childNodes.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      .arrays.groups_;
            lVar35 = (uVar17 & 0xff) * 4;
            uVar43 = (&UNK_0051605c)[lVar35];
            bVar45 = (&UNK_0051605d)[lVar35];
            bVar47 = (&UNK_0051605e)[lVar35];
            bVar49 = (&UNK_0051605f)[lVar35];
            pCVar22 = (ConfigBlockSymbol *)(ulong)((uint)uVar17 & 7);
            local_2c8 = (ConfigRule *)0x0;
            uVar51 = uVar43;
            bVar53 = bVar45;
            bVar55 = bVar47;
            bVar57 = bVar49;
            uVar59 = uVar43;
            bVar61 = bVar45;
            bVar63 = bVar47;
            bVar65 = bVar49;
            uVar67 = uVar43;
            bVar69 = bVar45;
            bVar71 = bVar47;
            bVar73 = bVar49;
            do {
              pSVar3 = &(pCVar30->super_Symbol).kind + uVar21 * 4;
              auVar40[0] = -((char)*pSVar3 == uVar43);
              auVar40[1] = -(*(byte *)((long)pSVar3 + 1) == bVar45);
              auVar40[2] = -(*(byte *)((long)pSVar3 + 2) == bVar47);
              auVar40[3] = -(*(byte *)((long)pSVar3 + 3) == bVar49);
              auVar40[4] = -(*(undefined1 *)(pSVar3 + 1) == uVar51);
              auVar40[5] = -(*(byte *)((long)pSVar3 + 5) == bVar53);
              auVar40[6] = -(*(byte *)((long)pSVar3 + 6) == bVar55);
              auVar40[7] = -(*(byte *)((long)pSVar3 + 7) == bVar57);
              auVar40[8] = -((char)((string_view *)(pSVar3 + 2))->_M_len == uVar59);
              auVar40[9] = -(*(byte *)((long)pSVar3 + 9) == bVar61);
              auVar40[10] = -(*(byte *)((long)pSVar3 + 10) == bVar63);
              auVar40[0xb] = -(*(byte *)((long)pSVar3 + 0xb) == bVar65);
              auVar40[0xc] = -(*(undefined1 *)(pSVar3 + 3) == uVar67);
              auVar40[0xd] = -(*(byte *)((long)pSVar3 + 0xd) == bVar69);
              auVar40[0xe] = -(*(byte *)((long)pSVar3 + 0xe) == bVar71);
              auVar40[0xf] = -(*(byte *)((long)pSVar3 + 0xf) == bVar73);
              uVar20 = (uint)(ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe);
              if (uVar20 != 0) {
                ppVar23 = (ppVar27->second).childNodes.table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                          .arrays.elements_;
                __n = *(size_t *)(lVar6 + 8);
                __s1 = *(void **)(lVar6 + 0x10);
                local_268 = (value_type_pointer)
                            CONCAT17(bVar57,CONCAT16(bVar55,CONCAT15(bVar53,CONCAT14(uVar51,CONCAT13
                                                  (bVar49,CONCAT12(bVar47,CONCAT11(bVar45,uVar43))))
                                                  )));
                local_298 = pCVar30;
                local_288 = pCVar22;
                uStack_260 = uVar59;
                bStack_25f = bVar61;
                bStack_25e = bVar63;
                bStack_25d = bVar65;
                uStack_25c = uVar67;
                bStack_25b = bVar69;
                bStack_25a = bVar71;
                bStack_259 = bVar73;
                do {
                  uVar10 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                    }
                  }
                  ppVar25 = ppVar23 + uVar21 * 0xf + (ulong)uVar10;
                  sVar7 = (ppVar25->first)._M_len;
                  bVar37 = __n == sVar7;
                  if ((__n != 0) && (__n == sVar7)) {
                    iVar13 = bcmp(__s1,(ppVar25->first)._M_str,__n);
                    bVar37 = iVar13 == 0;
                    pCVar30 = local_298;
                    uVar43 = (undefined1)local_268;
                    bVar45 = local_268._1_1_;
                    bVar47 = local_268._2_1_;
                    bVar49 = local_268._3_1_;
                    uVar51 = local_268._4_1_;
                    bVar53 = local_268._5_1_;
                    bVar55 = local_268._6_1_;
                    bVar57 = local_268._7_1_;
                    uVar59 = uStack_260;
                    bVar61 = bStack_25f;
                    bVar63 = bStack_25e;
                    bVar65 = bStack_25d;
                    uVar67 = uStack_25c;
                    bVar69 = bStack_25b;
                    bVar71 = bStack_25a;
                    bVar73 = bStack_259;
                  }
                  local_2f8 = pIVar14;
                  if (bVar37) goto LAB_002c99c2;
                  uVar20 = uVar20 - 1 & uVar20;
                  pCVar22 = local_288;
                } while (uVar20 != 0);
              }
              if ((*(byte *)((long)&(&(pCVar30->super_Symbol).name)[uVar21]._M_len + 7) &
                  *(byte *)&pCVar22[0x42c8].defaultLiblist._M_ptr) == 0) break;
              pCVar8 = (ConfigRule *)
                       (ppVar27->second).childNodes.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                       .arrays.groups_size_mask;
              poVar12 = &local_2c8->liblist;
              local_2c8 = (ConfigRule *)
                          ((long)&(local_2c8->liblist).
                                  super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                                  ._M_payload.
                                  super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                                  ._M_payload + 1);
              uVar21 = (long)&(poVar12->
                              super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                              )._M_payload.
                              super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                              ._M_payload + uVar21 + 1 & (ulong)pCVar8;
            } while (local_2c8 <= pCVar8);
            ppVar25 = (value_type_pointer)0x0;
LAB_002c99c2:
          } while (ppVar25 != (value_type_pointer)0x0);
          if (((pIVar14 == (InstanceBodySymbol *)0x0) &&
              ((ppVar27->second).childNodes.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
               .size_ctrl.size != 0)) &&
             (uVar21 = (syntax->instances).elements._M_extent._M_extent_value + 1, 1 < uVar21)) {
            local_258 = ((context->scope).ptr)->compilation;
            uVar26 = 0;
            bVar37 = false;
            do {
              ppSVar18 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)((syntax->instances).elements._M_ptr + uVar26 * 2));
              this_00 = (HierarchicalInstanceSyntax *)*ppSVar18;
              if (this_00->decl == (InstanceNameSyntax *)0x0) {
                sVar75 = (string_view)(ZEXT816(0x4ffe75) << 0x40);
              }
              else {
                sVar75 = parsing::Token::valueText(&this_00->decl->name);
              }
              local_250 = sVar75;
              uVar17 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)this_02,&local_250);
              sVar7 = local_250._M_len;
              uVar28 = uVar17 >> ((byte)(this_02->childNodes).table_.
                                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                        .arrays.groups_size_index & 0x3f);
              pgVar31 = (ppVar27->second).childNodes.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                        .arrays.groups_;
              lVar35 = (uVar17 & 0xff) * 4;
              uVar44 = (&UNK_0051605c)[lVar35];
              uVar46 = (&UNK_0051605d)[lVar35];
              uVar48 = (&UNK_0051605e)[lVar35];
              uVar50 = (&UNK_0051605f)[lVar35];
              local_268 = (value_type_pointer)local_250._M_str;
              uVar34 = (ulong)((uint)uVar17 & 7);
              uVar33 = 0;
              uVar52 = uVar44;
              uVar54 = uVar46;
              uVar56 = uVar48;
              uVar58 = uVar50;
              uVar60 = uVar44;
              uVar62 = uVar46;
              uVar64 = uVar48;
              uVar66 = uVar50;
              uVar68 = uVar44;
              uVar70 = uVar46;
              uVar72 = uVar48;
              uVar74 = uVar50;
              do {
                pgVar2 = pgVar31 + uVar28;
                auVar41[0] = -(pgVar2->m[0].n == uVar44);
                auVar41[1] = -(pgVar2->m[1].n == uVar46);
                auVar41[2] = -(pgVar2->m[2].n == uVar48);
                auVar41[3] = -(pgVar2->m[3].n == uVar50);
                auVar41[4] = -(pgVar2->m[4].n == uVar52);
                auVar41[5] = -(pgVar2->m[5].n == uVar54);
                auVar41[6] = -(pgVar2->m[6].n == uVar56);
                auVar41[7] = -(pgVar2->m[7].n == uVar58);
                auVar41[8] = -(pgVar2->m[8].n == uVar60);
                auVar41[9] = -(pgVar2->m[9].n == uVar62);
                auVar41[10] = -(pgVar2->m[10].n == uVar64);
                auVar41[0xb] = -(pgVar2->m[0xb].n == uVar66);
                auVar41[0xc] = -(pgVar2->m[0xc].n == uVar68);
                auVar41[0xd] = -(pgVar2->m[0xd].n == uVar70);
                auVar41[0xe] = -(pgVar2->m[0xe].n == uVar72);
                auVar41[0xf] = -(pgVar2->m[0xf].n == uVar74);
                uVar20 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
                uVar29 = uVar28;
                uVar32 = uVar33;
                lVar35 = uVar28 * 0x10;
                if (uVar20 != 0) {
                  ppVar25 = (ppVar27->second).childNodes.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                            .arrays.elements_;
                  local_298 = (ConfigBlockSymbol *)
                              CONCAT17(uVar58,CONCAT16(uVar56,CONCAT15(uVar54,CONCAT14(uVar52,
                                                  CONCAT13(uVar50,CONCAT12(uVar48,CONCAT11(uVar46,
                                                  uVar44)))))));
                  uStack_290 = uVar60;
                  uStack_28f = uVar62;
                  uStack_28e = uVar64;
                  uStack_28d = uVar66;
                  uStack_28c = uVar68;
                  uStack_28b = uVar70;
                  uStack_28a = uVar72;
                  uStack_289 = uVar74;
                  local_240 = uVar28 * 0x10;
                  local_238 = uVar33;
                  local_230 = pgVar31;
                  local_228 = uVar28;
                  local_220 = uVar34;
                  do {
                    uVar10 = 0;
                    if (uVar20 != 0) {
                      for (; (uVar20 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                      }
                    }
                    ppVar23 = ppVar25 + uVar28 * 0xf + (ulong)uVar10;
                    sVar5 = (ppVar23->first)._M_len;
                    bVar38 = sVar7 == sVar5;
                    if ((sVar7 != 0) && (sVar7 == sVar5)) {
                      iVar13 = bcmp(local_268,(ppVar23->first)._M_str,sVar7);
                      bVar38 = iVar13 == 0;
                      uVar44 = (uchar)local_298;
                      uVar46 = local_298._1_1_;
                      uVar48 = local_298._2_1_;
                      uVar50 = local_298._3_1_;
                      uVar52 = local_298._4_1_;
                      uVar54 = local_298._5_1_;
                      uVar56 = local_298._6_1_;
                      uVar58 = local_298._7_1_;
                      uVar60 = uStack_290;
                      uVar62 = uStack_28f;
                      uVar64 = uStack_28e;
                      uVar66 = uStack_28d;
                      uVar68 = uStack_28c;
                      uVar70 = uStack_28b;
                      uVar72 = uStack_28a;
                      uVar74 = uStack_289;
                    }
                    if (bVar38) goto LAB_002c9c4e;
                    uVar20 = uVar20 - 1 & uVar20;
                    uVar29 = local_228;
                    pgVar31 = local_230;
                    uVar32 = local_238;
                    lVar35 = local_240;
                    uVar34 = local_220;
                  } while (uVar20 != 0);
                }
                if ((pgVar31->m[lVar35 + 0xf].n &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[uVar34]) == 0) break;
                uVar9 = (ppVar27->second).childNodes.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                        .arrays.groups_size_mask;
                uVar33 = uVar32 + 1;
                uVar28 = uVar29 + uVar32 + 1 & uVar9;
              } while (uVar33 <= uVar9);
              ppVar23 = (value_type_pointer)0x0;
LAB_002c9c4e:
              if ((ppVar23 == (value_type_pointer)0x0) ||
                 (pCVar8 = (ppVar23->second).rule, pCVar8 == (ConfigRule *)0x0)) {
                local_2d8 = local_288;
                if (!bVar37) {
                  pSVar15 = (context->scope).ptr;
                  local_208 = parsing::Token::range(this);
                  Compilation::getDefinition
                            (&local_2b8.first,local_258,local_280,pSVar15,local_208,
                             (DiagCode)0xd10006);
                  bVar37 = true;
                  local_2f8 = (InstanceBodySymbol *)local_2b8.first.definition;
                  local_2c8 = local_2b8.first.configRule;
                  local_2d8 = local_2b8.first.configRoot;
                }
                local_2b8.first.definition = &local_2f8->super_Symbol;
                local_2b8.first.configRoot = local_2d8;
                local_2b8.first.configRule = local_2c8;
                local_2b8.second = this_00;
                SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                ::
                emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                          ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                            *)&local_160,&local_2b8);
                local_288 = local_2d8;
              }
              else {
                pSVar15 = (context->scope).ptr;
                local_1f8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
                Compilation::getDefinition
                          (&local_1b8,local_258,local_280,pSVar15,pCVar8,local_1f8,
                           (DiagCode)0xd10006);
                local_2b8.first.configRule = local_1b8.configRule;
                local_2b8.first.definition = local_1b8.definition;
                local_2b8.first.configRoot = local_1b8.configRoot;
                local_2b8.second = this_00;
                SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                ::
                emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                          ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                            *)&local_160,&local_2b8);
                local_2d8 = local_1b8.configRoot;
              }
              if ((ppVar23 != (value_type_pointer)0x0) && (local_2d8 != (ConfigBlockSymbol *)0x0)) {
                iVar76 = boost::unordered::detail::foa::
                         table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                         ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                  *)&ppVar23->second);
                if (iVar76.p_ != (table_element_pointer)0x0) {
LAB_002c9e19:
                  anon_unknown.dwarf_ccca1c::checkForInvalidNestedConfigNodes
                            (context,&(iVar76.p_)->second,local_2d8);
                  puVar19 = iVar76.pc_ + 2;
                  do {
                    puVar36 = puVar19;
                    puVar19 = iVar76.pc_;
                    ppVar24 = iVar76.p_ + 1;
                    if (((uint)iVar76.pc_ & 0xf) == 0xe) goto LAB_002c9e68;
                    puVar1 = puVar36 + -1;
                    iVar76.p_ = ppVar24;
                    iVar76.pc_ = puVar19 + 1;
                    puVar19 = puVar36 + 1;
                  } while (*puVar1 == '\0');
                  puVar36 = puVar36 + -1;
                  if (*puVar1 == '\x01') {
                    ppVar24 = (table_element_pointer)0x0;
                  }
                  goto LAB_002c9e5d;
                }
              }
LAB_002c9ec0:
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar21 >> 1);
          }
        }
        if (local_1a0 != local_188) {
          operator_delete(local_1a0);
        }
      }
      if (local_160.configRoot != (ConfigBlockSymbol *)0x0) {
        lVar35 = (long)local_160.configRoot << 5;
        defResult_00 = local_160.definition;
        do {
          fromSyntax::anon_class_48_6_08dfe5ab::operator()
                    (&local_1e8,(DefinitionLookupResult *)defResult_00,
                     *(HierarchicalInstanceSyntax **)&(defResult_00->location).field_0x0);
          defResult_00 = (Symbol *)&defResult_00->parentScope;
          lVar35 = lVar35 + -0x20;
        } while (lVar35 != 0);
        if (local_160.definition != &local_148) {
          operator_delete(local_160.definition);
        }
        goto LAB_002c95b2;
      }
      this_01 = local_270;
      if (local_160.definition != &local_148) {
        operator_delete(local_160.definition);
        this_01 = local_270;
      }
    }
    pSVar15 = (context->scope).ptr;
    local_218 = parsing::Token::range(this);
    Compilation::getDefinition(&local_160,this_01,local_280,pSVar15,local_218,(DiagCode)0xd10006);
    fromSyntax::anon_class_48_6_08dfe5ab::operator()
              (&local_1e8,&local_160,(HierarchicalInstanceSyntax *)0x0);
  }
  else {
    primitive = Compilation::getGateType(local_270,sVar75);
    anon_unknown_287::createPrimitives<slang::syntax::PrimitiveInstantiationSyntax>
              (primitive,syntax,(HierarchicalInstanceSyntax *)0x0,context,results,implicitNets,
               (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                *)local_f8);
  }
LAB_002c95b2:
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::delete_((allocator_type)local_f8._136_8_,
            (table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
             *)local_68);
  return;
LAB_002c9e68:
  do {
    auVar42[0] = -(*puVar36 == '\0');
    auVar42[1] = -(puVar36[1] == '\0');
    auVar42[2] = -(puVar36[2] == '\0');
    auVar42[3] = -(puVar36[3] == '\0');
    auVar42[4] = -(puVar36[4] == '\0');
    auVar42[5] = -(puVar36[5] == '\0');
    auVar42[6] = -(puVar36[6] == '\0');
    auVar42[7] = -(puVar36[7] == '\0');
    auVar42[8] = -(puVar36[8] == '\0');
    auVar42[9] = -(puVar36[9] == '\0');
    auVar42[10] = -(puVar36[10] == '\0');
    auVar42[0xb] = -(puVar36[0xb] == '\0');
    auVar42[0xc] = -(puVar36[0xc] == '\0');
    auVar42[0xd] = -(puVar36[0xd] == '\0');
    auVar42[0xe] = -(puVar36[0xe] == '\0');
    auVar42[0xf] = -(puVar36[0xf] == '\0');
    uVar20 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe);
    if (uVar20 == 0x7fff) {
      puVar36 = puVar36 + 0x10;
      ppVar24 = ppVar24 + 0xf;
    }
    else {
      uVar10 = 0;
      if ((uVar20 ^ 0x7fff) != 0) {
        for (; ((uVar20 ^ 0x7fff) >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      if (puVar36[uVar10] == '\x01') {
        ppVar24 = (table_element_pointer)0x0;
      }
      else {
        puVar36 = puVar36 + uVar10;
        ppVar24 = ppVar24 + uVar10;
      }
    }
  } while (uVar20 == 0x7fff);
LAB_002c9e5d:
  iVar76.p_ = ppVar24;
  iVar76.pc_ = puVar36;
  if (ppVar24 == (table_element_pointer)0x0) goto LAB_002c9ec0;
  goto LAB_002c9e19;
}

Assistant:

void PrimitiveInstanceSymbol::fromSyntax(const PrimitiveInstantiationSyntax& syntax,
                                         const ASTContext& context,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets) {
    SmallSet<std::string_view, 8> implicitNetNames;
    auto& comp = context.getCompilation();
    auto name = syntax.type.valueText();

    // If the type is not an identifier then it should be a gate keyword.
    if (syntax.type.kind != TokenKind::Identifier) {
        auto prim = comp.getGateType(name);
        SLANG_ASSERT(prim);
        createPrimitives(*prim, syntax, nullptr, context, results, implicitNets, implicitNetNames);
        return;
    }

    auto createPrims = [&](const Compilation::DefinitionLookupResult& defResult,
                           const HierarchicalInstanceSyntax* specificInstance) {
        if (defResult.configRule)
            defResult.configRule->isUsed = true;

        auto def = defResult.definition;
        if (def) {
            if (def->kind == SymbolKind::Primitive) {
                createPrimitives(def->as<PrimitiveSymbol>(), syntax, specificInstance, context,
                                 results, implicitNets, implicitNetNames);
                return;
            }

            SLANG_ASSERT(syntax.strength || syntax.delay);
            if (syntax.strength) {
                auto& diag = context.addDiag(diag::InstanceWithStrength,
                                             syntax.strength->sourceRange());
                diag << def->name;
                if (specificInstance)
                    diag << specificInstance->sourceRange();
            }
            else if (comp.hasFlag(CompilationFlags::AllowBareValParamAssignment) &&
                     syntax.delay->kind == SyntaxKind::DelayControl) {
                // We're allowing this to be a hierarchical instantiation with a single param
                // assignment, and just pretending the parentheses were provided.
                auto& delaySyntax = syntax.delay->as<DelaySyntax>();
                auto& delayVal = *delaySyntax.delayValue;

                SmallVector<TokenOrSyntax> parameters;
                parameters.push_back(comp.emplace<OrderedParamAssignmentSyntax>(delayVal));

                auto missing = [&](TokenKind tk, SourceLocation loc) {
                    return Token::createMissing(comp, tk, loc);
                };

                auto pvas = comp.emplace<ParameterValueAssignmentSyntax>(
                    delaySyntax.hash,
                    missing(TokenKind::OpenParenthesis, delayVal.getFirstToken().location()),
                    parameters.copy(comp),
                    missing(TokenKind::CloseParenthesis, delayVal.getLastToken().location()));

                // Rebuild the instance list. The const_casts are fine because
                // we're going to immediately treat them as const again below.
                SmallVector<TokenOrSyntax> instanceBuf;
                if (specificInstance) {
                    instanceBuf.push_back(
                        const_cast<HierarchicalInstanceSyntax*>(specificInstance));
                }
                else {
                    for (auto inst : syntax.instances)
                        instanceBuf.push_back(const_cast<HierarchicalInstanceSyntax*>(inst));
                }

                auto instantiation = comp.emplace<HierarchyInstantiationSyntax>(
                    syntax.attributes, syntax.type, pvas, instanceBuf.copy(comp), syntax.semi);
                InstanceSymbol::fromSyntax(comp, *instantiation, context, results, implicitNets);
                return;
            }
            else {
                auto& diag = context.addDiag(diag::InstanceWithDelay,
                                             syntax.delay->getFirstToken().location() + 1);
                if (specificInstance)
                    diag << specificInstance->sourceRange();
            }
        }
        UninstantiatedDefSymbol::fromSyntax(comp, syntax, specificInstance, context, results,
                                            implicitNets, implicitNetNames);
    };

    // Check if there are configuration instance override paths to check.
    auto parentInst = context.scope->getContainingInstance();
    if (parentInst && parentInst->parentInstance && parentInst->parentInstance->resolvedConfig) {
        ResolvedInstanceRules instanceRules;
        resolveInstanceOverrides(*parentInst->parentInstance->resolvedConfig, context, syntax, name,
                                 diag::UnknownPrimitive, instanceRules);
        if (!instanceRules.empty()) {
            for (auto& [defResult, instSyntax] : instanceRules)
                createPrims(defResult, instSyntax);
            return;
        }
    }

    // Simple case; just create the primitive instances.
    auto defResult = comp.getDefinition(name, *context.scope, syntax.type.range(),
                                        diag::UnknownPrimitive);
    createPrims(defResult, nullptr);
}